

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

int stbi__compute_transparency(stbi__png *z,stbi_uc *tc,int out_n)

{
  int in_EAX;
  char *in_RCX;
  undefined4 in_register_00000014;
  long lVar1;
  int iVar2;
  int in_R8D;
  
  iVar2 = (int)z * (int)tc;
  if (in_R8D == 2) {
    if (iVar2 != 0) {
      lVar1 = 0;
      do {
        *(char *)(CONCAT44(in_register_00000014,out_n) + 1 + lVar1 * 2) =
             -(*(char *)(CONCAT44(in_register_00000014,out_n) + lVar1 * 2) != *in_RCX);
        lVar1 = lVar1 + 1;
        in_EAX = iVar2;
      } while (iVar2 != (int)lVar1);
    }
  }
  else if (iVar2 != 0) {
    lVar1 = 0;
    do {
      if (((*(char *)(CONCAT44(in_register_00000014,out_n) + lVar1 * 4) == *in_RCX) &&
          (*(char *)(CONCAT44(in_register_00000014,out_n) + 1 + lVar1 * 4) == in_RCX[1])) &&
         (*(char *)(CONCAT44(in_register_00000014,out_n) + 2 + lVar1 * 4) == in_RCX[2])) {
        *(undefined1 *)(CONCAT44(in_register_00000014,out_n) + 3 + lVar1 * 4) = 0;
      }
      lVar1 = lVar1 + 1;
      in_EAX = iVar2;
    } while (iVar2 != (int)lVar1);
  }
  return in_EAX;
}

Assistant:

static int stbi__compute_transparency(stbi__png *z, stbi_uc tc[3], int out_n)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   // compute color-based transparency, assuming we've
   // already got 255 as the alpha value in the output
   STBI_ASSERT(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i=0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 255);
         p += 2;
      }
   } else {
      for (i=0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}